

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sprites.c
# Opt level: O1

void doae(dw_rom *rom)

{
  vpatch(rom,0x13b4,0x4b,0x48,0,0x34,0,0x49,0,0x35,0,0x4c,0,0x36,0,0x4d,0,0x37,0,0x48,0,0x4a,0,0x49,
         0,0x4b,0,0x4c,0,0x4e,0,0x4d,0,0x4f,0,0x48,0,0x34,0,0x49,0,0x35,0,0x4c,0,0x36,0,0x4d,0,0x37,
         0,0x48,0,0x4a,0,0x49,0,0x4b,0,0x4c,0,0x4e,0,0x4d,0,0x4f,0,0xa4);
  vpatch(rom,0x14b4,0x49,0x50,0,0x26,0,0x51,0,0x27,0,0x54,0,0x28,0,0x55,0,0x29,0,0x50,0,0x52,0,0x51,
         0,0x53,0,0x54,0,0x56,0,0x55,0,0x57,0,0x50,0,0x26,0,0x51,0,0x27,0,0x54,0,0x28,0,0x55,0,0x29,
         0,0x50,0,0x52,0,0x51,0,0x53,0,0x54,0,0x56,0,0x55,0,0x57,0,0xb9);
  vpatch(rom,0x15b4,0x3f,0x30,0,0x42,0,0x31,0,0x43,0,0x32,0,0x46,0,0x33,0,0x47,0,0x40,0,0x42,0,0x41,
         0,0x43,0,0x44,0,0x46,0,0x45,0,0x47,0,0x30,0,0x42,0,0x31,0,0x43,0,0x32,0,0x46,0,0x33,0,0x47,
         0,0x40,0,0x42,0,0x41,0,0x43,0,0x44,0,0x46,0,0x45,0,0x47);
  vpatch(rom,0x15fe,2,0xb8,0);
  vpatch(rom,0x16b4,0x44,0x26,0x40,0x50,0x40,0x27,0x40,0x51,0x40,0x28,0x40,0x54,0x40,0x29,0x40,0x55,
         0x40,0x52,0x40,0x50,0x40,0x53,0x40,0x51,0x40,0x56,0x40,0x54,0x40,0x57,0x40,0x55,0x40,0x26,
         0x40,0x50,0x40,0x27,0x40,0x51,0x40,0x28,0x40,0x54,0x40,0x29,0x40,0x55,0x40,0x52,0x40,0x50,
         0x40,0x53,0x40,0x51,0x40,0x56,0x40,0x54,0x40,0x57,0x40,0x55,0x40,0xbc);
  vpatch(rom,0x16fe,2,0xbd,0x40);
  vpatch(rom,0x121c0,0x40,0x78,0x7c,0xfc,0x7c,0x7c,0xf8,0,0xf8,0xf8,0xf8,0xfc,0x88,0xfc,0xf8,0xf8,0,
         7,0xf,0x1f,0x1f,0x1a,2,1,0x32,7,0xf,0x18,7,0x1f,0x1f,0xf,0x3f,0x3f,0x3f,0x3f,0x3f,0x3f,0x1f
         ,0x1e,0,0xff,0xfe,0x7f,2,0x3f,0x1f,0,0,0xfc,0xf8,0xf0,0xf0,0xfc,0xf8,0,0xf8,0xfe,0x7f,0xff,
         0x4e,0xfc,0xf8,0xf8,0);
  vpatch(rom,0x12220,0x20,7,0xf,0x1f,0x1f,0x1f,0xf,7,0x38,7,0xf,0x1f,7,0x18,0x1f,0xf,0x3f,0xc,0x18,
         0x18,0x18,0x1c,0xf,0xf,0,0xf,0x1f,0x1f,7,0x1f,0xf,0,0);
  vpatch(rom,0x122a0,0x60,0x3f,0x3f,0x3f,0x3f,0x3f,0x1f,0x1e,0,0x7f,0xff,0xff,0xc0,0x3f,0x1f,0,0,
         0xfc,0xfc,0xfc,0xfc,0xfc,0xf8,0,0xf8,0xff,0xff,0xfe,0,0xfc,0xf8,0xf8,0,7,0xf,0x1f,0x1f,0x1f
         ,0x1e,0xf,1,7,0xf,0x1f,0x1c,3,0x1f,0xf,7,0xe0,0xf0,0xf8,0xf8,0xa0,0x20,0x10,0xa0,0xe0,0xf0,
         0x80,0x78,0xf0,0xf8,0xf0,0xf0,0xe);
  vpatch(rom,0x1a94,3,0x36,0x30,0x15);
  vpatch(rom,0x12700,0x10,1,1,5,5,0,7,0x1f,0x1f,3,7,7,7,7,6,0x1a,0x38);
  vpatch(rom,0x12720,0x10,0x80,0x80,0xa0,0xa0,0,0xe0,0xf8,0xfc,0xc0,0xe0,0xe0,0xe0,0xe0,0x60,0x58,
         0x1c);
  vpatch(rom,0x12740,0x10,0x6f,0x6f,0x27,8,0xd,8,0xd,0xd,0x1c,0x1f,0x3f,0x1f,0xf,0xf,0xf,3);
  vpatch(rom,0x12760,0x10,0xf8,0xf8,0xd2,0x36,0xf0,0x70,0xf8,0x70,0x3c,0xfe,0xfe,0xfc,0xf0,0xf0,0xc0
         ,0);
  vpatch(rom,0x12880,0x40,1,1,5,5,0,7,0x1f,0x3f,3,7,7,7,7,6,0x1a,0x38,0x80,0x80,0xa0,0xa0,0,0xe0,
         0xf8,0xf8,0xc0,0xe0,0xe0,0xe0,0xe0,0x60,0x58,0x1c,0x1f,0x1f,0x4b,0x6c,0xf,0xe,0x1f,0xe,0x3c
         ,0x7f,0x7f,0x3f,0xf,0xf,3,0,0xf6,0xf6,0xe4,0x10,0xb0,0x10,0xb0,0xb0,0x38,0xf8,0xfc,0xf8,
         0xf0,0xf0,0xf0,0xc0);
  vpatch(rom,0x12b25,2,3,3);
  vpatch(rom,0x12b2e,1,3);
  vpatch(rom,0x12b35,3,0x90,0xa0,0x1e);
  vpatch(rom,0x12b3e,2,0xfe,0x1e);
  vpatch(rom,0x12b65,3,0,3,3);
  vpatch(rom,0x12b6d,3,3,0,3);
  vpatch(rom,0x12b75,3,8,0x90,0xc0);
  vpatch(rom,0x12b7c,3,0xfe,0x7c,0xc0);
  if ((rom->flags[0xe] & 8) == 0) {
    return;
  }
  set_text(rom,0x7e56,anon_var_dwarf_943);
  set_text(rom,0x8774,"TuiLu");
  return;
}

Assistant:

static void doae(dw_rom *rom)
{
    vpatch(rom, 0x013b4,  75, 0x48, 0x00, 0x34, 0x00, 0x49, 0x00, 0x35, 0x00, 0x4c, 0x00, 0x36, 0x00, 0x4d, 0x00, 0x37, 0x00, 0x48, 0x00, 0x4a, 0x00, 0x49, 0x00, 0x4b, 0x00, 0x4c, 0x00, 0x4e, 0x00, 0x4d, 0x00, 0x4f, 0x00, 0x48, 0x00, 0x34, 0x00, 0x49, 0x00, 0x35, 0x00, 0x4c, 0x00, 0x36, 0x00, 0x4d, 0x00, 0x37, 0x00, 0x48, 0x00, 0x4a, 0x00, 0x49, 0x00, 0x4b, 0x00, 0x4c, 0x00, 0x4e, 0x00, 0x4d, 0x00, 0x4f, 0x00, 0xa4, 0x00, 0xa5, 0x00, 0xa2, 0x00, 0xa3, 0x00, 0xa8, 0x00, 0xac);
    vpatch(rom, 0x014b4,  73, 0x50, 0x00, 0x26, 0x00, 0x51, 0x00, 0x27, 0x00, 0x54, 0x00, 0x28, 0x00, 0x55, 0x00, 0x29, 0x00, 0x50, 0x00, 0x52, 0x00, 0x51, 0x00, 0x53, 0x00, 0x54, 0x00, 0x56, 0x00, 0x55, 0x00, 0x57, 0x00, 0x50, 0x00, 0x26, 0x00, 0x51, 0x00, 0x27, 0x00, 0x54, 0x00, 0x28, 0x00, 0x55, 0x00, 0x29, 0x00, 0x50, 0x00, 0x52, 0x00, 0x51, 0x00, 0x53, 0x00, 0x54, 0x00, 0x56, 0x00, 0x55, 0x00, 0x57, 0x00, 0xb9, 0x00, 0xa9, 0x03, 0xaa, 0x00, 0xab, 0x03, 0xbd);
    vpatch(rom, 0x015b4,  63, 0x30, 0x00, 0x42, 0x00, 0x31, 0x00, 0x43, 0x00, 0x32, 0x00, 0x46, 0x00, 0x33, 0x00, 0x47, 0x00, 0x40, 0x00, 0x42, 0x00, 0x41, 0x00, 0x43, 0x00, 0x44, 0x00, 0x46, 0x00, 0x45, 0x00, 0x47, 0x00, 0x30, 0x00, 0x42, 0x00, 0x31, 0x00, 0x43, 0x00, 0x32, 0x00, 0x46, 0x00, 0x33, 0x00, 0x47, 0x00, 0x40, 0x00, 0x42, 0x00, 0x41, 0x00, 0x43, 0x00, 0x44, 0x00, 0x46, 0x00, 0x45, 0x00, 0x47);
    vpatch(rom, 0x015fe,   2, 0xb8, 0x00);
    vpatch(rom, 0x016b4,  68, 0x26, 0x40, 0x50, 0x40, 0x27, 0x40, 0x51, 0x40, 0x28, 0x40, 0x54, 0x40, 0x29, 0x40, 0x55, 0x40, 0x52, 0x40, 0x50, 0x40, 0x53, 0x40, 0x51, 0x40, 0x56, 0x40, 0x54, 0x40, 0x57, 0x40, 0x55, 0x40, 0x26, 0x40, 0x50, 0x40, 0x27, 0x40, 0x51, 0x40, 0x28, 0x40, 0x54, 0x40, 0x29, 0x40, 0x55, 0x40, 0x52, 0x40, 0x50, 0x40, 0x53, 0x40, 0x51, 0x40, 0x56, 0x40, 0x54, 0x40, 0x57, 0x40, 0x55, 0x40, 0xbc, 0x03, 0xb9, 0x40);
    vpatch(rom, 0x016fe,   2, 0xbd, 0x40);
    vpatch(rom, 0x121c0,  64, 0x78, 0x7C, 0xFC, 0x7C, 0x7C, 0xF8, 0x00, 0xF8, 0xF8, 0xF8, 0xFC, 0x88, 0xFC, 0xF8, 0xF8, 0x00, 0x07, 0x0F, 0x1F, 0x1F, 0x1A, 0x02, 0x01, 0x32, 0x07, 0x0F, 0x18, 0x07, 0x1F, 0x1F, 0x0F, 0x3F, 0x3F, 0x3F, 0x3F, 0x3F, 0x3F, 0x1F, 0x1E, 0x00, 0xFF, 0xFE, 0x7F, 0x02, 0x3F, 0x1F, 0x00, 0x00, 0xFC, 0xF8, 0xF0, 0xF0, 0xFC, 0xF8, 0x00, 0xF8, 0xFE, 0x7F, 0xFF, 0x4E, 0xFC, 0xF8, 0xF8, 0x00);
    vpatch(rom, 0x12220,  32, 0x07, 0x0F, 0x1F, 0x1F, 0x1F, 0x0F, 0x07, 0x38, 0x07, 0x0F, 0x1F, 0x07, 0x18, 0x1F, 0x0F, 0x3F, 0x0C, 0x18, 0x18, 0x18, 0x1C, 0x0F, 0x0F, 0x00, 0x0F, 0x1F, 0x1F, 0x07, 0x1F, 0x0F, 0x00, 0x00);
    vpatch(rom, 0x122a0,  96, 0x3F, 0x3F, 0x3F, 0x3F, 0x3F, 0x1F, 0x1E, 0x00, 0x7F, 0xFF, 0xFF, 0xC0, 0x3F, 0x1F, 0x00, 0x00, 0xFC, 0xFC, 0xFC, 0xFC, 0xFC, 0xF8, 0x00, 0xF8, 0xFF, 0xFF, 0xFE, 0x00, 0xFC, 0xF8, 0xF8, 0x00, 0x07, 0x0F, 0x1F, 0x1F, 0x1F, 0x1E, 0x0F, 0x01, 0x07, 0x0F, 0x1F, 0x1C, 0x03, 0x1F, 0x0F, 0x07, 0xE0, 0xF0, 0xF8, 0xF8, 0xA0, 0x20, 0x10, 0xA0, 0xE0, 0xF0, 0x80, 0x78, 0xF0, 0xF8, 0xF0, 0xF0, 0x0E, 0x1E, 0x1E, 0x1F, 0x1F, 0x0F, 0x00, 0x0F, 0x0F, 0x1F, 0x1F, 0x00, 0x1F, 0x0F, 0x0F, 0x00, 0x48, 0x0C, 0x1C, 0xFC, 0xFC, 0xF8, 0x78, 0x80, 0xF8, 0xF8, 0xFC, 0x08, 0xFC, 0xF8, 0x80, 0x00);
// replace Lorik with Liu Bei
    vpatch(rom, 0x01a94,   3, 0x36, 0x30, 0x15);
    vpatch(rom, 0x12700,  16, 0x01, 0x01, 0x05, 0x05, 0x00, 0x07, 0x1f, 0x1f, 0x03, 0x07, 0x07, 0x07, 0x07, 0x06, 0x1a, 0x38);
    vpatch(rom, 0x12720,  16, 0x80, 0x80, 0xa0, 0xa0, 0x00, 0xe0, 0xf8, 0xfc, 0xc0, 0xe0, 0xe0, 0xe0, 0xe0, 0x60, 0x58, 0x1c);
    vpatch(rom, 0x12740,  16, 0x6f, 0x6f, 0x27, 0x08, 0x0d, 0x08, 0x0d, 0x0d, 0x1c, 0x1f, 0x3f, 0x1f, 0x0f, 0x0f, 0x0f, 0x03);
    vpatch(rom, 0x12760,  16, 0xf8, 0xf8, 0xd2, 0x36, 0xf0, 0x70, 0xf8, 0x70, 0x3c, 0xfe, 0xfe, 0xfc, 0xf0, 0xf0, 0xc0, 0x00);
    vpatch(rom, 0x12880,  64, 0x01, 0x01, 0x05, 0x05, 0x00, 0x07, 0x1f, 0x3f, 0x03, 0x07, 0x07, 0x07, 0x07, 0x06, 0x1a, 0x38, 0x80, 0x80, 0xa0, 0xa0, 0x00, 0xe0, 0xf8, 0xf8, 0xc0, 0xe0, 0xe0, 0xe0, 0xe0, 0x60, 0x58, 0x1c, 0x1f, 0x1f, 0x4b, 0x6c, 0x0f, 0x0e, 0x1f, 0x0e, 0x3c, 0x7f, 0x7f, 0x3f, 0x0f, 0x0f, 0x03, 0x00, 0xf6, 0xf6, 0xe4, 0x10, 0xb0, 0x10, 0xb0, 0xb0, 0x38, 0xf8, 0xfc, 0xf8, 0xf0, 0xf0, 0xf0, 0xc0);
// tweak the carrying Gwaelin sprites
    vpatch(rom, 0x12b25,   2, 0x03, 0x03);
    vpatch(rom, 0x12b2e,   1, 0x03);
    vpatch(rom, 0x12b35,   3, 0x90, 0xa0, 0x1e);
    vpatch(rom, 0x12b3e,   2, 0xfe, 0x1e);
    vpatch(rom, 0x12b65,   3, 0x00, 0x03, 0x03);
    vpatch(rom, 0x12b6d,   3, 0x03, 0x00, 0x03);
    vpatch(rom, 0x12b75,   3, 0x08, 0x90, 0xc0);
    vpatch(rom, 0x12b7c,   3, 0xfe, 0x7c, 0xc0);
    if (CUSTOM_SPELLS(rom)) {
        set_text(rom, 0x07e56, "Xian\xff"
                               "Huo \xff"
                               "YiXin\xff"
                               "Sha Du \xff"
                               " Ce Mian \xff"
                               "Suo Di \xff"
                               "GuiHui\xff"
                               "TuiLu\xff"
                               "Yin Xian\xff"
                               "Huo Shen\xff");
        set_text(rom, 0x08774, "TuiLu");
    }
}